

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O2

bool __thiscall CETestSuite::test(CETestSuite *this,bool test_success,string *function,int *line)

{
  undefined7 in_register_00000031;
  CETestSuite *pCVar1;
  allocator local_42;
  undefined1 local_41;
  
  local_41 = test_success;
  if ((int)CONCAT71(in_register_00000031,test_success) == 0) {
    pCVar1 = (CETestSuite *)&stack0xffffffffffffffc0;
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,"Generic test FAILED.",&local_42);
    log_failure(pCVar1,(string *)&stack0xffffffffffffffc0,function,line);
  }
  else {
    pCVar1 = (CETestSuite *)&stack0xffffffffffffffc0;
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,"Generic test SUCCEEDED.",&local_42);
    log_success(pCVar1,(string *)&stack0xffffffffffffffc0,function,line);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  (*this->_vptr_CETestSuite[0xf])(this,&local_41);
  return (bool)local_41;
}

Assistant:

bool CETestSuite::test(bool  test_success, 
                       const std::string& function,
                       const int&         line)
{
    // Values equal within tolerance
    if (test_success) {
        log_success("Generic test SUCCEEDED.", function, line);
    } 
    // Values not within tolerance
    else {
        log_failure("Generic test FAILED.", function, line);
    }

    update_pass(test_success);
    return test_success;
}